

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void CreateDefaultArgumentFunctionWrappers(ExpressionContext *ctx)

{
  FunctionData *function;
  uint uVar1;
  int iVar2;
  FunctionData **ppFVar3;
  ArgumentData *pAVar4;
  ExprBase *pEVar5;
  uint index;
  uint index_00;
  ExprFunctionAccess *expr;
  InplaceStr functionName;
  DirectChainedMap<FunctionData_*> valueFunctions;
  TraceScope traceScope;
  
  if (CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token == '\0') {
    iVar2 = __cxa_guard_acquire(&CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token);
    if (iVar2 != 0) {
      CreateDefaultArgumentFunctionWrappers::token =
           NULLC::TraceGetToken("analyze","CreateDefaultArgumentFunctionWrappers");
      __cxa_guard_release(&CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,CreateDefaultArgumentFunctionWrappers::token);
  DirectChainedMap<FunctionData_*>::DirectChainedMap(&valueFunctions,ctx->allocator);
  index = 0;
  do {
    if ((ctx->functions).count <= index) {
      DirectChainedMap<FunctionData_*>::~DirectChainedMap(&valueFunctions);
      NULLC::TraceScope::~TraceScope(&traceScope);
      return;
    }
    ppFVar3 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,index);
    function = *ppFVar3;
    if ((function->importModule == (ModuleData *)0x0) &&
       (((function->scope == ctx->globalScope || (function->scope->ownerType != (TypeBase *)0x0)) &&
        (function->isHidden == false)))) {
      for (index_00 = 0; index_00 < (function->arguments).count; index_00 = index_00 + 1) {
        pAVar4 = SmallArray<ArgumentData,_4U>::operator[](&function->arguments,index_00);
        pEVar5 = pAVar4->value;
        if (pEVar5 != (ExprBase *)0x0) {
          if (pAVar4->valueFunction != (FunctionData *)0x0) {
            __assert_fail("argument.valueFunction == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x3446,"void CreateDefaultArgumentFunctionWrappers(ExpressionContext &)")
            ;
          }
          if (pEVar5->type != (TypeBase *)0x0) {
            uVar1 = pEVar5->type->typeID;
            if (uVar1 == 0) goto LAB_0017a1a1;
            if (uVar1 == 0x1a) {
              pEVar5 = CreateCast(ctx,pAVar4->source,pEVar5,pAVar4->type,true);
            }
          }
          functionName = GetDefaultArgumentWrapperFunctionName(ctx,function,pAVar4->name->name);
          uVar1 = InplaceStr::hash(&functionName);
          ppFVar3 = DirectChainedMap<FunctionData_*>::find(&valueFunctions,uVar1);
          if (ppFVar3 == (FunctionData **)0x0) {
            pEVar5 = CreateValueFunctionWrapper
                               (ctx,pAVar4->source,(SynBase *)0x0,pEVar5,functionName);
            if (pEVar5 == (ExprBase *)0x0) {
LAB_0017a1eb:
              __assert_fail("isType<ExprFunctionAccess>(access)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x345d,
                            "void CreateDefaultArgumentFunctionWrappers(ExpressionContext &)");
            }
            if (pEVar5->typeID != 0) {
              if (pEVar5->typeID != 0x26) goto LAB_0017a1eb;
              pAVar4->valueFunction = (FunctionData *)pEVar5[1]._vptr_ExprBase;
              uVar1 = InplaceStr::hash(&functionName);
              DirectChainedMap<FunctionData_*>::insert
                        (&valueFunctions,uVar1,(FunctionData *)pEVar5[1]._vptr_ExprBase);
            }
          }
          else {
            pAVar4->valueFunction = *ppFVar3;
          }
        }
LAB_0017a1a1:
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

void CreateDefaultArgumentFunctionWrappers(ExpressionContext &ctx)
{
	TRACE_SCOPE("analyze", "CreateDefaultArgumentFunctionWrappers");

	DirectChainedMap<FunctionData*> valueFunctions(ctx.allocator);

	for(unsigned i = 0; i < ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.functions[i];

		if(function->importModule)
			continue;

		// Handle only global visible functions
		if(function->scope != ctx.globalScope && !function->scope->ownerType)
			continue;

		if(function->isHidden)
			continue;

		// Go through all function arguments
		for(unsigned k = 0; k < function->arguments.size(); k++)
		{
			ArgumentData &argument = function->arguments[k];

			if(argument.value)
			{
				assert(argument.valueFunction == NULL);

				ExprBase *value = argument.value;

				if(isType<TypeError>(value->type))
					continue;

				if(isType<TypeFunctionSet>(value->type))
					value = CreateCast(ctx, argument.source, argument.value, argument.type, true);

				InplaceStr functionName = GetDefaultArgumentWrapperFunctionName(ctx, function, argument.name->name);

				if(FunctionData **valueFunction = valueFunctions.find(functionName.hash()))
				{
					argument.valueFunction = *valueFunction;
					continue;
				}

				ExprBase *access = CreateValueFunctionWrapper(ctx, argument.source, NULL, value, functionName);

				if(isType<ExprError>(access))
					continue;

				assert(isType<ExprFunctionAccess>(access));

				if(ExprFunctionAccess *expr = getType<ExprFunctionAccess>(access))
				{
					argument.valueFunction = expr->function;

					valueFunctions.insert(functionName.hash(), expr->function);
				}
			}
		}
	}
}